

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ConvertTimeStampMacroString(char *str,time_t *tmt)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  time_t tVar4;
  int year;
  int sec;
  int min;
  int hour;
  int day;
  int month;
  char *ptr;
  char buffer [27];
  tm tmt2;
  time_t *tmt_local;
  char *str_local;
  
  if (((str != (char *)0x0) && (tmt != (time_t *)0x0)) && (sVar2 = strlen(str), sVar2 < 0x1b)) {
    strcpy((char *)&ptr,str);
    ptr._7_1_ = 0;
    pcVar3 = strstr(ConvertTimeStampMacroString::month_names,(char *)((long)&ptr + 4));
    if (pcVar3 == (char *)0x0) {
      return false;
    }
    atoi(buffer);
    atoi(buffer + 3);
    atoi(buffer + 6);
    iVar1 = atoi(buffer + 9);
    atoi(buffer + 0xc);
    unique0x10000160 = iVar1;
    tVar4 = mktime((tm *)(buffer + 0x18));
    *tmt = tVar4;
    return true;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertTimeStampMacroString(const char* str, time_t* tmt)
{
  if (!str || !tmt || strlen(str) > 26) {
    return false;
  }

  struct tm tmt2;

  // __TIMESTAMP__
  // The date and time of the last modification of the current source file,
  // expressed as a string literal in the form Ddd Mmm Date hh:mm:ss yyyy,
  /// where Ddd is the abbreviated day of the week and Date is an integer
  // from 1 to 31.

  // index:   0123456789
  //                    0123456789
  //                              0123456789
  // format:  Ddd Mmm Date hh:mm:ss yyyy
  // example: Fri Dec 19 14:34:58 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[27];
  strcpy(buffer, str);

  buffer[7] = 0;
  char* ptr = strstr(month_names, buffer + 4);
  if (!ptr) {
    return false;
  }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 8);
  int hour = atoi(buffer + 11);
  int min = atoi(buffer + 14);
  int sec = atoi(buffer + 17);
  int year = atoi(buffer + 20);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour = hour;
  tmt2.tm_min = min;
  tmt2.tm_sec = sec;
  tmt2.tm_wday = 0;
  tmt2.tm_yday = 0;
  tmt2.tm_mday = day;
  tmt2.tm_mon = month;
  tmt2.tm_year = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}